

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf_crypt_insecure_fuzzer.cc
# Opt level: O1

void __thiscall FuzzHelper::doChecks(FuzzHelper *this)

{
  Pl_DCT::setMemoryLimit(100000000);
  Pl_DCT::setScanLimit(0x32);
  Pl_PNGFilter::setMemoryLimit(1000000);
  Pl_RunLength::setMemoryLimit(1000000);
  Pl_TIFFPredictor::setMemoryLimit(1000000);
  Pl_Flate::memory_limit(200000);
  Pl_DCT::setThrowOnCorruptData(true);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\ninfo: starting testWrite\n",0x1a);
  testWrite(this);
  return;
}

Assistant:

void
FuzzHelper::doChecks()
{
    // Limit the memory used to decompress JPEG files during fuzzing. Excessive memory use during
    // fuzzing is due to corrupt JPEG data which sometimes cannot be detected before
    // jpeg_start_decompress is called. During normal use of qpdf very large JPEGs can occasionally
    // occur legitimately and therefore must be allowed during normal operations.
    Pl_DCT::setMemoryLimit(100'000'000);
    Pl_DCT::setScanLimit(50);

    Pl_PNGFilter::setMemoryLimit(1'000'000);
    Pl_RunLength::setMemoryLimit(1'000'000);
    Pl_TIFFPredictor::setMemoryLimit(1'000'000);
    Pl_Flate::memory_limit(200'000);

    // Do not decompress corrupt data. This may cause extended runtime within jpeglib without
    // exercising additional code paths in qpdf, and potentially causing counterproductive timeouts.
    Pl_DCT::setThrowOnCorruptData(true);

    // Get as much coverage as possible in parts of the library that
    // might benefit from fuzzing.
    std::cerr << "\ninfo: starting testWrite\n";
    testWrite();
}